

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

void __thiscall
anurbs::NurbsCurveGeometry<3L>::set_weights
          (NurbsCurveGeometry<3L> *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *value)

{
  bool bVar1;
  runtime_error *prVar2;
  Index IVar3;
  Index IVar4;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *value_local;
  NurbsCurveGeometry<3L> *this_local;
  
  bVar1 = is_rational(this);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Geometry is not rational");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  IVar3 = length<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>(value);
  IVar4 = nb_poles(this);
  if (IVar3 != IVar4) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Invalid size");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->m_weights,
             (DenseBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)value);
  return;
}

Assistant:

void set_weights(Eigen::Ref<const Eigen::VectorXd> value)
    {
        if (!is_rational()) {
            throw std::runtime_error("Geometry is not rational");
        }

        if (length(value) != nb_poles()) {
            throw std::runtime_error("Invalid size");
        }

        m_weights = value;
    }